

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Type *type,bool underlying)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  string *extraout_RAX;
  string *psVar4;
  string *extraout_RAX_00;
  long *plVar5;
  size_type *psVar6;
  Namespace *this_00;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 local_50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  undefined8 uStack_20;
  undefined2 local_18;
  
  uVar1 = *(uint *)this;
  if ((ulong)uVar1 == 0xe) {
    local_30._M_allocated_capacity._0_4_ = *(undefined4 *)(this + 4);
    local_18 = *(undefined2 *)(this + 0x18);
    local_30._M_allocated_capacity._4_4_ = 0;
    local_30._8_8_ = *(undefined8 *)(this + 8);
    uStack_20 = *(undefined8 *)(this + 0x10);
    GenType_abi_cxx11_((string *)local_50,(_anonymous_namespace_ *)local_30._M_local_buf,(Type *)0x0
                       ,SUB41(local_30._M_allocated_capacity._0_4_,0));
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x379344);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    psVar4 = (string *)(local_50 + 0x10);
    if ((string *)local_50._0_8_ != psVar4) {
      operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      psVar4 = extraout_RAX_00;
    }
    return psVar4;
  }
  if (uVar1 == 0xf) {
    psVar4 = *(string **)(this + 8);
    this_00 = (Namespace *)psVar4[5]._M_string_length;
  }
  else {
    psVar4 = *(string **)(this + 0x10);
    if (psVar4 == (string *)0x0 || (char)type != '\0') {
      if ((uVar1 < 0x13) && ((0x73fffU >> (uVar1 & 0x1f) & 1) != 0)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,
                   &DAT_00378c74 + *(int *)(&DAT_00378c74 + (ulong)uVar1 * 4),
                   (allocator<char> *)&local_70);
        return extraout_RAX;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                    ,0xaa,"const char *flatbuffers::TypeName(const BaseType)");
    }
    this_00 = (Namespace *)psVar4[5]._M_string_length;
  }
  psVar4 = Namespace::GetFullyQualifiedName(__return_storage_ptr__,this_00,psVar4,1000);
  return psVar4;
}

Assistant:

static std::string GenType(const Type &type, bool underlying = false) {
  switch (type.base_type) {
    case BASE_TYPE_STRUCT:
      return type.struct_def->defined_namespace->GetFullyQualifiedName(
          type.struct_def->name);
    case BASE_TYPE_VECTOR: return "[" + GenType(type.VectorType()) + "]";
    default:
      if (type.enum_def && !underlying) {
        return type.enum_def->defined_namespace->GetFullyQualifiedName(
            type.enum_def->name);
      } else {
        return TypeName(type.base_type);
      }
  }
}